

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HuffmanTree.h
# Opt level: O0

void __thiscall
bwtil::HuffmanTree<unsigned_long>::storeTree
          (HuffmanTree<unsigned_long> *this,vector<bool,_std::allocator<bool>_> *code,Node n,
          vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
          *nodes_vec)

{
  reference pvVar1;
  vector<bool,_std::allocator<bool>_> *in_RDX;
  HuffmanTree<unsigned_long> *in_RSI;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  *in_RDI;
  Node in_stack_00000000;
  vector<bool,_std::allocator<bool>_> coder;
  vector<bool,_std::allocator<bool>_> codel;
  unsigned_long in_stack_fffffffffffffe38;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  *in_stack_fffffffffffffe40;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  *pvVar2;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  *__x;
  undefined1 __x_00;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffea0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed0;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffed8;
  vector<bool,_std::allocator<bool>_> *in_stack_fffffffffffffef8;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff00;
  vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
  *in_stack_ffffffffffffffe0;
  HuffmanTree<unsigned_long> *this_00;
  
  __x = (vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
         *)&stack0x00000008;
  this_00 = in_RSI;
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  __x_00 = (undefined1)((ulong)in_RSI >> 0x38);
  std::vector<bool,_std::allocator<bool>_>::vector
            (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_fffffffffffffea0,(bool)__x_00);
  std::vector<bool,_std::allocator<bool>_>::push_back(in_stack_fffffffffffffea0,(bool)__x_00);
  if (((ulong)__x[1].
              super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x100) == 0) {
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pvVar1 = std::
             vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             ::at(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    in_stack_fffffffffffffe38 = pvVar1->node_number;
    in_stack_fffffffffffffe40 =
         (vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
          *)pvVar1->freq;
    pvVar2 = *(vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
               **)&pvVar1->leaf;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector(in_RDI,__x);
    storeTree(this_00,in_RDX,in_stack_00000000,in_stack_ffffffffffffffe0);
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::~vector(pvVar2);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x12e833);
  }
  else {
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)&in_RDI[1].
                     super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (size_type)
                 __x[1].
                 super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  if (((ulong)__x[1].
              super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
              ._M_impl.super__Vector_impl_data._M_start & 0x10000) == 0) {
    std::vector<bool,_std::allocator<bool>_>::vector
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    pvVar1 = std::
             vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
             ::at(in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
    pvVar2 = *(vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
               **)&pvVar1->leaf;
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::vector(in_RDI,__x);
    storeTree(this_00,in_RDX,in_stack_00000000,in_stack_ffffffffffffffe0);
    std::
    vector<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
    ::~vector(pvVar2);
    std::vector<bool,_std::allocator<bool>_>::~vector
              ((vector<bool,_std::allocator<bool>_> *)0x12e96d);
  }
  else {
    std::
    vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
    ::operator[]((vector<std::vector<bool,_std::allocator<bool>_>,_std::allocator<std::vector<bool,_std::allocator<bool>_>_>_>
                  *)&in_RDI[1].
                     super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                     ._M_impl.super__Vector_impl_data._M_finish,
                 (size_type)
                 __x[1].
                 super__Vector_base<bwtil::HuffmanTree<unsigned_long>::Node,_std::allocator<bwtil::HuffmanTree<unsigned_long>::Node>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::vector<bool,_std::allocator<bool>_>::operator=
              (in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
  }
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x12e9bf)
  ;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)0x12e9cc)
  ;
  return;
}

Assistant:

void storeTree(vector<bool> code, Node n,vector<Node> nodes_vec){

		vector<bool> codel = code;
		vector<bool> coder = code;

		codel.push_back(0);
		coder.push_back(1);

		//T node_nr = n.node_number;

		if(n.leaf_left){//leaf

			codes[n.left] = codel;
			//left_leafs.at(node_nr) = true;
			//left[node_nr] = n.left;

		}else{

			//left_leafs.at(node_nr) = false;
			//left[node_nr] = n.left;

			storeTree(codel,nodes_vec.at(n.left), nodes_vec);

		}

		if(n.leaf_right){//leaf

			codes[n.right] = coder;
			//right_leafs.at(node_nr) = true;
			//right[node_nr] = n.right;

		}else{

			//right_leafs.at(node_nr) = false;
			//right[node_nr] = n.right;

			storeTree(coder,nodes_vec.at(n.right), nodes_vec);

		}

	}